

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void check_interrupt_switch(SignalSwitcher *ss)

{
  runtime_error *this;
  undefined8 extraout_RAX;
  
  if (!interrupt_switch) {
    return;
  }
  check_interrupt_switch();
  fputs("Error: procedure was interrupted\n",_stderr);
  raise(2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Error: procedure was interrupted.\n");
  check_interrupt_switch();
  __cxa_free_exception(this);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void check_interrupt_switch(SignalSwitcher &ss)
{
    if (interrupt_switch)
    {
        ss.restore_handle();
        print_errmsg("Error: procedure was interrupted\n");
        raise(SIGINT);
        #ifdef _FOR_R
        Rcpp::checkUserInterrupt();
        #elif !defined(DONT_THROW_ON_INTERRUPT)
        throw std::runtime_error("Error: procedure was interrupted.\n");
        #endif
    }
}